

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::DateFormat::format
          (DateFormat *this,UDate date,UnicodeString *appendTo,FieldPosition *fieldPosition)

{
  int iVar1;
  undefined4 extraout_var;
  UErrorCode ec;
  UErrorCode local_2c;
  Calendar *this_00;
  
  if (this->fCalendar != (Calendar *)0x0) {
    iVar1 = (*(this->fCalendar->super_UObject)._vptr_UObject[3])();
    this_00 = (Calendar *)CONCAT44(extraout_var,iVar1);
    if (this_00 != (Calendar *)0x0) {
      local_2c = U_ZERO_ERROR;
      Calendar::setTimeInMillis(this_00,date,&local_2c);
      if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
        (*(this->super_Format).super_UObject._vptr_UObject[8])(this,this_00,appendTo,fieldPosition);
      }
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
    }
  }
  return appendTo;
}

Assistant:

UnicodeString&
DateFormat::format(UDate date, UnicodeString& appendTo, FieldPosition& fieldPosition) const {
    if (fCalendar != NULL) {
        // Use a clone of our calendar instance
        Calendar* calClone = fCalendar->clone();
        if (calClone != NULL) {
            UErrorCode ec = U_ZERO_ERROR;
            calClone->setTime(date, ec);
            if (U_SUCCESS(ec)) {
                format(*calClone, appendTo, fieldPosition);
            }
            delete calClone;
        }
    }
    return appendTo;
}